

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void select_tx_block(AV1_COMP *cpi,MACROBLOCK *x,int blk_row,int blk_col,int block,TX_SIZE tx_size,
                    int depth,BLOCK_SIZE plane_bsize,ENTROPY_CONTEXT *ta,ENTROPY_CONTEXT *tl,
                    TXFM_CONTEXT *tx_above,TXFM_CONTEXT *tx_left,RD_STATS *rd_stats,
                    int64_t prev_level_rd,int64_t ref_best_rd,int *is_cost_valid,
                    FAST_TX_SEARCH_MODE ftxs_mode)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  TXFM_CONTEXT *tx_left_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  RD_STATS *unaff_RBX;
  ENTROPY_CONTEXT *in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  int in_stack_00000008;
  RD_STATS *in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  undefined4 *in_stack_00000050;
  int bw;
  int index;
  int idx;
  int idy;
  ENTROPY_CONTEXT *ptl;
  ENTROPY_CONTEXT *pta;
  RD_STATS split_rd_stats;
  int split_score;
  int threshold;
  int search_level;
  TxCandidateInfo no_split;
  int try_split;
  int try_no_split;
  macroblock_plane *p;
  int ctx;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined8 in_stack_fffffffffffffe68;
  undefined2 uVar5;
  TXFM_CONTEXT *in_stack_fffffffffffffe70;
  TXFM_CONTEXT *in_stack_fffffffffffffe78;
  int *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_ffffffffffffff00;
  BLOCK_SIZE in_stack_ffffffffffffff08;
  ENTROPY_CONTEXT *in_stack_ffffffffffffff10;
  undefined5 in_stack_ffffffffffffff18;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 uVar7;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  TX_SIZE tx_size_00;
  int in_stack_ffffffffffffff2c;
  int64_t in_stack_ffffffffffffff30;
  MACROBLOCK *in_stack_ffffffffffffff38;
  AV1_COMP *in_stack_ffffffffffffff40;
  uint uVar8;
  uint blk_col_00;
  undefined4 in_stack_ffffffffffffff98;
  TXFM_CONTEXT *tx_above_00;
  undefined3 in_stack_ffffffffffffffb0;
  int txfm_partition_ctx;
  byte bVar9;
  ENTROPY_CONTEXT *ref_best_rd_00;
  
  uVar5 = (undefined2)((ulong)in_stack_fffffffffffffe68 >> 0x30);
  txfm_partition_ctx = CONCAT13(in_R9B,in_stack_ffffffffffffffb0);
  av1_init_rd_stats(in_stack_00000038);
  if (in_stack_00000048 < 0) {
    *in_stack_00000050 = 0;
  }
  else {
    tx_left_00 = (TXFM_CONTEXT *)(in_RSI + 0x1a0);
    tx_above_00 = (TXFM_CONTEXT *)**(undefined8 **)(in_RSI + 0x2058);
    iVar3 = txfm_partition_context
                      (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                       (BLOCK_SIZE)((ushort)uVar5 >> 8),(TX_SIZE)uVar5);
    bVar9 = (byte)((uint)txfm_partition_ctx >> 0x18);
    if ((((*(byte *)(in_RDI + 0x426f0) & 1) != 0) || (uVar7 = false, ""[bVar9] != '\x04')) &&
       (in_stack_ffffffffffffff1e = true, uVar7 = in_stack_ffffffffffffff1e,
       (*(byte *)(in_RDI + 0x426f2) & 1) == 0)) {
      in_stack_ffffffffffffff1e = tx_size_wide[bVar9] == tx_size_high[bVar9];
      uVar7 = in_stack_ffffffffffffff1e;
    }
    blk_col_00 = (uint)(byte)uVar7;
    uVar6 = bVar9 != 0 && in_stack_00000008 < 2;
    uVar8 = (uint)(byte)uVar6;
    ref_best_rd_00 = in_RSI;
    if (((bVar9 != 0) && (uVar8 == 1)) && ((blk_col_00 == 1 && (0 < *(int *)(in_RDI + 0x60c10))))) {
      prune_tx_split_no_split
                ((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (BLOCK_SIZE)((ulong)in_stack_fffffffffffffec8 >> 0x38),
                 (int)in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                 (TX_SIZE)((ulong)in_stack_fffffffffffffec0 >> 0x18),in_stack_fffffffffffffeb8,
                 (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffee8);
    }
    if (((*(int *)(in_RDI + 0x60d68) != 0) && (*(int *)(ref_best_rd_00 + 0x25680) != 0)) &&
       ((uVar8 != 0 && (*(short *)(*(long *)(in_RSI + 0x20) + (long)in_R8D * 2) != 0)))) {
      blk_col_00 = 0;
    }
    if (blk_col_00 != 0) {
      try_tx_block_no_split
                ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                 (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (TX_SIZE)((ulong)in_stack_fffffffffffffec8 >> 0x18),in_stack_ffffffffffffff00,
                 in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,
                 (ENTROPY_CONTEXT *)
                 CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff1e,
                                         CONCAT15(uVar6,in_stack_ffffffffffffff18))),
                 in_stack_ffffffffffffff20,
                 (RD_STATS *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff30,(FAST_TX_SEARCH_MODE)in_stack_ffffffffffffff38,
                 (TxCandidateInfo *)in_stack_ffffffffffffff40);
      if (*(int *)(in_RDI + 0x60c04) != 0) {
        cVar2 = (char)*(int *)(in_RDI + 0x60c04);
        if (in_stack_00000048 < 0x7fffffffffffffff - (0x7fffffffffffffff >> (cVar2 + 1U & 0x3f))) {
          *in_stack_00000050 = 0;
          return;
        }
        if (in_stack_00000040 < 0x7fffffffffffffff - (0x7fffffffffffffff >> (cVar2 + 2U & 0x3f))) {
          uVar8 = 0;
        }
      }
      if ((*(int *)(in_RDI + 0x60c00) != 0) &&
         (*(short *)(*(long *)(in_RSI + 0x20) + (long)in_R8D * 2) == 0)) {
        uVar8 = 0;
      }
    }
    tx_size_00 = (TX_SIZE)((uint)in_stack_ffffffffffffff28 >> 0x18);
    if ((((*(int *)(ref_best_rd_00 + 0x2b40) == 8) && (uVar8 != 0)) &&
        (in_stack_00000048 != 0x7fffffffffffffff)) &&
       ((iVar1 = *(int *)(in_RDI + 0x60bec), -1 < iVar1 &&
        (iVar4 = ml_predict_tx_split((MACROBLOCK *)CONCAT44(iVar3,in_stack_ffffffffffffff98),
                                     (BLOCK_SIZE)((ulong)in_RSI >> 0x38),(int)in_RSI,blk_col_00,
                                     (TX_SIZE)(uVar8 >> 0x18)),
        SBORROW4(iVar4,-iVar1) != iVar4 + iVar1 < 0)))) {
      uVar8 = 0;
    }
    if (uVar8 != 0) {
      try_tx_block_split(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                         (int)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,tx_size_00,0,
                         (BLOCK_SIZE)uVar8,in_RSI,
                         (ENTROPY_CONTEXT *)CONCAT44(iVar3,in_stack_ffffffffffffff98),tx_above_00,
                         tx_left_00,txfm_partition_ctx,CONCAT44(in_EDX,in_ECX),
                         (int64_t)ref_best_rd_00,(FAST_TX_SEARCH_MODE)in_RDI,unaff_RBX);
    }
    memcpy(in_stack_00000038,&stack0xffffffffffffff40,0x28);
    *in_stack_00000050 = 0;
  }
  return;
}

Assistant:

static inline void select_tx_block(
    const AV1_COMP *cpi, MACROBLOCK *x, int blk_row, int blk_col, int block,
    TX_SIZE tx_size, int depth, BLOCK_SIZE plane_bsize, ENTROPY_CONTEXT *ta,
    ENTROPY_CONTEXT *tl, TXFM_CONTEXT *tx_above, TXFM_CONTEXT *tx_left,
    RD_STATS *rd_stats, int64_t prev_level_rd, int64_t ref_best_rd,
    int *is_cost_valid, FAST_TX_SEARCH_MODE ftxs_mode) {
  assert(tx_size < TX_SIZES_ALL);
  av1_init_rd_stats(rd_stats);
  if (ref_best_rd < 0) {
    *is_cost_valid = 0;
    return;
  }

  MACROBLOCKD *const xd = &x->e_mbd;
  assert(blk_row < max_block_high(xd, plane_bsize, 0) &&
         blk_col < max_block_wide(xd, plane_bsize, 0));
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int ctx = txfm_partition_context(tx_above + blk_col, tx_left + blk_row,
                                         mbmi->bsize, tx_size);
  struct macroblock_plane *const p = &x->plane[0];

  int try_no_split = (cpi->oxcf.txfm_cfg.enable_tx64 ||
                      txsize_sqr_up_map[tx_size] != TX_64X64) &&
                     (cpi->oxcf.txfm_cfg.enable_rect_tx ||
                      tx_size_wide[tx_size] == tx_size_high[tx_size]);
  int try_split = tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH;
  TxCandidateInfo no_split = { INT64_MAX, 0, TX_TYPES };

  // Prune tx_split and no-split based on sub-block properties.
  if (tx_size != TX_4X4 && try_split == 1 && try_no_split == 1 &&
      cpi->sf.tx_sf.prune_tx_size_level > 0) {
    prune_tx_split_no_split(x, plane_bsize, blk_row, blk_col, tx_size,
                            &try_no_split, &try_split,
                            cpi->sf.tx_sf.prune_tx_size_level);
  }

  if (cpi->sf.rt_sf.skip_tx_no_split_var_based_partition) {
    if (x->try_merge_partition && try_split && p->eobs[block]) try_no_split = 0;
  }

  // Try using current block as a single transform block without split.
  if (try_no_split) {
    try_tx_block_no_split(cpi, x, blk_row, blk_col, block, tx_size, depth,
                          plane_bsize, ta, tl, ctx, rd_stats, ref_best_rd,
                          ftxs_mode, &no_split);

    // Speed features for early termination.
    const int search_level = cpi->sf.tx_sf.adaptive_txb_search_level;
    if (search_level) {
      if ((no_split.rd - (no_split.rd >> (1 + search_level))) > ref_best_rd) {
        *is_cost_valid = 0;
        return;
      }
      if (no_split.rd - (no_split.rd >> (2 + search_level)) > prev_level_rd) {
        try_split = 0;
      }
    }
    if (cpi->sf.tx_sf.txb_split_cap) {
      if (p->eobs[block] == 0) try_split = 0;
    }
  }

  // ML based speed feature to skip searching for split transform blocks.
  if (x->e_mbd.bd == 8 && try_split &&
      !(ref_best_rd == INT64_MAX && no_split.rd == INT64_MAX)) {
    const int threshold = cpi->sf.tx_sf.tx_type_search.ml_tx_split_thresh;
    if (threshold >= 0) {
      const int split_score =
          ml_predict_tx_split(x, plane_bsize, blk_row, blk_col, tx_size);
      if (split_score < -threshold) try_split = 0;
    }
  }

  RD_STATS split_rd_stats;
  split_rd_stats.rdcost = INT64_MAX;
  // Try splitting current block into smaller transform blocks.
  if (try_split) {
    try_tx_block_split(cpi, x, blk_row, blk_col, block, tx_size, depth,
                       plane_bsize, ta, tl, tx_above, tx_left, ctx, no_split.rd,
                       AOMMIN(no_split.rd, ref_best_rd), ftxs_mode,
                       &split_rd_stats);
  }

  if (no_split.rd < split_rd_stats.rdcost) {
    ENTROPY_CONTEXT *pta = ta + blk_col;
    ENTROPY_CONTEXT *ptl = tl + blk_row;
    p->txb_entropy_ctx[block] = no_split.txb_entropy_ctx;
    av1_set_txb_context(x, 0, block, tx_size, pta, ptl);
    txfm_partition_update(tx_above + blk_col, tx_left + blk_row, tx_size,
                          tx_size);
    for (int idy = 0; idy < tx_size_high_unit[tx_size]; ++idy) {
      for (int idx = 0; idx < tx_size_wide_unit[tx_size]; ++idx) {
        const int index =
            av1_get_txb_size_index(plane_bsize, blk_row + idy, blk_col + idx);
        mbmi->inter_tx_size[index] = tx_size;
      }
    }
    mbmi->tx_size = tx_size;
    update_txk_array(xd, blk_row, blk_col, tx_size, no_split.tx_type);
    const int bw = mi_size_wide[plane_bsize];
    set_blk_skip(x->txfm_search_info.blk_skip, 0, blk_row * bw + blk_col,
                 rd_stats->skip_txfm);
  } else {
    *rd_stats = split_rd_stats;
    if (split_rd_stats.rdcost == INT64_MAX) *is_cost_valid = 0;
  }
}